

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  result *prVar1;
  result *prVar2;
  result x;
  vector<Parser::result,_std::allocator<Parser::result>_> newLexRes;
  undefined1 auStack_1a8 [64];
  string local_168 [32];
  vector<Parser::result,_std::allocator<Parser::result>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [64];
  string local_50 [32];
  
  std::operator+(&local_b0,&prefix_abi_cxx11_,"test.txt");
  Lexer::goLex(&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1a8,
                 &prefix_abi_cxx11_,"result/");
  std::operator+(&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1a8,
                 "lexer.txt");
  Lexer::print(&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)auStack_1a8);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)&Parser::lineRec,
             (vector<int,_std::allocator<int>_> *)&Lexer::lineRec);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)Parser::endTran_abi_cxx11_,
              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)Lexer::endTran_abi_cxx11_);
  prVar1 = DAT_00121230;
  local_148.super__Vector_base<Parser::result,_std::allocator<Parser::result>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.super__Vector_base<Parser::result,_std::allocator<Parser::result>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<Parser::result,_std::allocator<Parser::result>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (prVar2 = Lexer::LexRes; prVar2 != prVar1; prVar2 = prVar2 + 1) {
    Lexer::result::result((result *)auStack_1a8,prVar2);
    std::__cxx11::string::string((string *)local_90,(string *)auStack_1a8);
    std::__cxx11::string::string((string *)(local_90 + 0x20),(string *)(auStack_1a8 + 0x20));
    std::__cxx11::string::string(local_50,local_168);
    std::vector<Parser::result,_std::allocator<Parser::result>_>::emplace_back<Parser::result>
              (&local_148,(result *)local_90);
    Parser::result::~result((result *)local_90);
    Lexer::result::~result((result *)auStack_1a8);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1a8,
                 &prefix_abi_cxx11_,"generator.txt");
  Parser::init((EVP_PKEY_CTX *)auStack_1a8);
  std::__cxx11::string::~string((string *)auStack_1a8);
  Parser::goParser(&local_148);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1a8,
                 &prefix_abi_cxx11_,"result/");
  std::operator+(&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1a8,
                 "parser.txt");
  Parser::printFile(&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)auStack_1a8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1a8,
                 &prefix_abi_cxx11_,"result/");
  std::operator+(&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1a8,
                 "Variable.txt");
  Parser::printVariable(&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)auStack_1a8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1a8,
                 &prefix_abi_cxx11_,"result/");
  std::operator+(&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1a8,
                 "Line.txt");
  Parser::printLine(&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)auStack_1a8);
  std::vector<Parser::result,_std::allocator<Parser::result>_>::~vector(&local_148);
  return 0;
}

Assistant:

int main(){
	//freopen(prefix + "tmp.txt","w",stdout);
	Lexer::goLex(prefix+"test.txt");
	Lexer::print(prefix+"result/"+"lexer.txt");
	Parser::lineRec = Lexer::lineRec;
	Parser::endTran = Lexer::endTran;
	vector<Parser::result> newLexRes;
	for(auto x : Lexer::LexRes){
		newLexRes.push_back((Parser::result){x.type , x.name , x.value});
	} 
	Parser::init(prefix+"generator.txt");
	Parser::goParser(newLexRes);

	Parser::printFile(prefix+"result/"+"parser.txt");

	Parser::printVariable(prefix+"result/"+"Variable.txt");
	Parser::printLine(prefix+"result/"+"Line.txt");
	return 0;
}